

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 minMaxQuery(AggInfo *pAggInfo,ExprList **ppMinMax)

{
  Expr *pEVar1;
  ExprList *pEVar2;
  long lVar3;
  u8 uVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  uchar uVar11;
  uchar uVar12;
  
  *ppMinMax = (ExprList *)0x0;
  if (pAggInfo->nFunc == 1) {
    pEVar1 = pAggInfo->aFunc->pExpr;
    pEVar2 = (pEVar1->x).pList;
    if (pEVar2 == (ExprList *)0x0) {
      return '\0';
    }
    if (pEVar2->nExpr != 1) {
      return '\0';
    }
    if (pEVar2->a->pExpr->op != 0x9a) {
      return '\0';
    }
    pbVar7 = (byte *)(pEVar1->u).zToken;
    bVar8 = *pbVar7;
    if (bVar8 == 0) {
      pcVar6 = "max";
      uVar9 = 0;
    }
    else {
      lVar3 = 0;
      bVar10 = bVar8;
      do {
        lVar5 = lVar3;
        uVar11 = ""[bVar10];
        uVar12 = ""[(byte)"min"[lVar5]];
        if (uVar11 != uVar12) goto LAB_00164e68;
        bVar10 = pbVar7[lVar5 + 1];
        lVar3 = lVar5 + 1;
      } while (bVar10 != 0);
      uVar12 = ""[(byte)"min"[lVar5 + 1]];
      uVar11 = '\0';
LAB_00164e68:
      uVar4 = '\x01';
      if (uVar11 == uVar12) goto LAB_00164ec4;
      pcVar6 = "max";
      do {
        pbVar7 = pbVar7 + 1;
        uVar9 = (ulong)bVar8;
        if (""[bVar8] != ""[(byte)*pcVar6]) break;
        pcVar6 = (char *)((byte *)pcVar6 + 1);
        bVar8 = *pbVar7;
        uVar9 = 0;
      } while (bVar8 != 0);
    }
    uVar4 = '\x02';
    if (""[uVar9] == ""[(byte)*pcVar6]) {
LAB_00164ec4:
      *ppMinMax = pEVar2;
      return uVar4;
    }
  }
  return '\0';
}

Assistant:

static u8 minMaxQuery(AggInfo *pAggInfo, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;          /* Return value */

  *ppMinMax = 0;
  if( pAggInfo->nFunc==1 ){
    Expr *pExpr = pAggInfo->aFunc[0].pExpr; /* Aggregate function */
    ExprList *pEList = pExpr->x.pList;      /* Arguments to agg function */

    assert( pExpr->op==TK_AGG_FUNCTION );
    if( pEList && pEList->nExpr==1 && pEList->a[0].pExpr->op==TK_AGG_COLUMN ){
      const char *zFunc = pExpr->u.zToken;
      if( sqlite3StrICmp(zFunc, "min")==0 ){
        eRet = WHERE_ORDERBY_MIN;
        *ppMinMax = pEList;
      }else if( sqlite3StrICmp(zFunc, "max")==0 ){
        eRet = WHERE_ORDERBY_MAX;
        *ppMinMax = pEList;
      }
    }
  }

  assert( *ppMinMax==0 || (*ppMinMax)->nExpr==1 );
  return eRet;
}